

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O2

void * Wlc_NtkToNdr(Wlc_Ntk_t *pNtk)

{
  ushort uVar1;
  int iVar2;
  Ndr_Data_t *p;
  uchar *puVar3;
  uint *puVar4;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pWVar5;
  Wlc_Obj_t *pWVar6;
  int Fill;
  int iVar7;
  int iVar8;
  char *pcVar9;
  uint uVar10;
  int *in_stack_ffffffffffffff98;
  char *pFunction;
  int local_44;
  Ndr_Data_t *local_40;
  Vec_Int_t *local_38;
  
  p = (Ndr_Data_t *)malloc(0x18);
  p->nCap = 0x10;
  puVar3 = (uchar *)malloc(0x10);
  p->pHead = puVar3;
  puVar4 = (uint *)malloc(0x100);
  p->pBody = puVar4;
  *puVar3 = '\x01';
  *puVar4 = 0;
  puVar3[1] = '\a';
  p->nSize = 2;
  iVar7 = 1;
  puVar4[1] = 1;
  iVar8 = 0;
  Ndr_DataAddTo(p,0,2);
  Ndr_DataResize(p,6);
  puVar3 = p->pHead;
  iVar2 = p->nSize;
  puVar3[iVar2] = '\x02';
  puVar4 = p->pBody;
  puVar4[iVar2] = 0;
  puVar3[(long)iVar2 + 1] = '\a';
  local_38 = (Vec_Int_t *)CONCAT44(local_38._4_4_,iVar2 + 2);
  p->nSize = iVar2 + 2;
  puVar4[(long)iVar2 + 1] = 1;
  Ndr_DataAddTo(p,2,iVar2);
  local_40 = p;
  Ndr_DataAddTo(p,0,iVar2);
  if (*puVar4 != (uint)local_38) {
    __assert_fail("(int)p->pBody[0] == p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                  ,0x21c,"int Ndr_AddModule(void *, int)");
  }
  p_00 = Vec_IntAlloc(10);
  for (; iVar8 < (pNtk->vPis).nSize; iVar8 = iVar8 + 1) {
    iVar2 = Vec_IntEntry(&pNtk->vPis,iVar8);
    pWVar5 = Wlc_NtkObj(pNtk,iVar2);
    local_44 = (int)(((long)pWVar5 - (long)pNtk->pObjs) / 0x18);
    in_stack_ffffffffffffff98 = (int *)0x0;
    Ndr_AddObject(local_40,0x102,3,pWVar5->End,pWVar5->Beg,*(uint *)pWVar5 >> 6 & 1,0,0,(int *)0x1,
                  (int)&local_44,(int *)0x0,(char *)0x18);
  }
  local_38 = &pNtk->vCos;
  do {
    iVar2 = pNtk->iObj;
    local_44 = iVar7;
    if (iVar2 <= iVar7) {
      for (iVar7 = 1; iVar7 < iVar2; iVar7 = iVar7 + 1) {
        pWVar5 = Wlc_NtkObj(pNtk,iVar7);
        if ((pWVar5->field_0x1 & 2) != 0) {
          pcVar9 = (char *)0x304e40;
          Vec_IntFill(p_00,1,iVar7);
          in_stack_ffffffffffffff98 = (int *)((ulong)in_stack_ffffffffffffff98 & 0xffffffff00000000)
          ;
          Ndr_AddObject(local_40,0x102,4,pWVar5->End,pWVar5->Beg,*(uint *)pWVar5 >> 6 & 1,1,
                        (int)p_00->pArray,in_stack_ffffffffffffff98,0,(int *)0x0,pcVar9);
        }
        iVar2 = pNtk->iObj;
      }
      Vec_IntFree(p_00);
      return local_40;
    }
    pWVar5 = Wlc_NtkObj(pNtk,iVar7);
    if ((undefined1  [24])((undefined1  [24])*pWVar5 & (undefined1  [24])0x3e) !=
        (undefined1  [24])0x0) {
      p_00->nSize = 0;
      for (iVar2 = 0; iVar2 < (int)pWVar5->nFanins; iVar2 = iVar2 + 1) {
        iVar8 = Wlc_ObjFaninId(pWVar5,iVar2);
        Vec_IntPush(p_00,iVar8);
      }
      uVar1 = *(ushort *)pWVar5;
      if ((uVar1 & 0x3f) == 6) {
        puVar4 = (uint *)Wlc_ObjFanins(pWVar5);
        iVar8 = pWVar5->End - pWVar5->Beg;
        iVar2 = -iVar8;
        if (0 < iVar8) {
          iVar2 = iVar8;
        }
        Ndr_ObjWriteConstant(puVar4,iVar2 + 1);
        uVar1 = *(ushort *)pWVar5;
        pcVar9 = Ndr_ObjWriteConstant::Buffer;
      }
      else {
        pcVar9 = (char *)0x0;
      }
      uVar10 = (uint)uVar1;
      if ((uVar1 & 0x3f) == 8) {
        pWVar6 = Wlc_ObjFanin0(pNtk,pWVar5);
        uVar10 = (uint)*(ushort *)pWVar5;
        pFunction = (char *)0x2b;
        iVar2 = 0x2b;
        if (pWVar6->End == pWVar6->Beg) goto LAB_00304d53;
      }
      else {
LAB_00304d53:
        if ((short)(uVar10 & 0x3f) == 3) {
          iVar2 = Vec_IntEntry(local_38,((pWVar5->field_10).Fanins[1] + (pNtk->vPos).nSize) -
                                        (pNtk->vPis).nSize);
          pWVar6 = Wlc_NtkObj(pNtk,iVar2);
          if (p_00->nSize != 0) {
            __assert_fail("Vec_IntSize(vFanins) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                          ,0xde,"void *Wlc_NtkToNdr(Wlc_Ntk_t *)");
          }
          Vec_IntPush(p_00,(int)(((long)pWVar6 - (long)pNtk->pObjs) / 0x18));
          Vec_IntFillExtra(p_00,7,Fill);
          uVar10 = (uint)*(ushort *)pWVar5;
          pFunction = (char *)0x59;
          iVar2 = 0x59;
        }
        else {
          pFunction = (char *)0x304dbf;
          iVar2 = Ndr_TypeWlc2Ndr(uVar10 & 0x3f);
          if (iVar2 < 1) {
            __assert_fail("Type > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                          ,0xe5,"void *Wlc_NtkToNdr(Wlc_Ntk_t *)");
          }
        }
      }
      in_stack_ffffffffffffff98 = (int *)0x0;
      Ndr_AddObject(local_40,0x102,iVar2,pWVar5->End,pWVar5->Beg,uVar10 >> 6 & 1,p_00->nSize,
                    (int)p_00->pArray,(int *)0x1,(int)&local_44,(int *)pcVar9,pFunction);
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

void * Wlc_NtkToNdr( Wlc_Ntk_t * pNtk )
{
    Wlc_Obj_t * pObj; 
    int i, k, iFanin, iOutId, Type;
    // create a new module
    void * pDesign = Ndr_Create( 1 );
    int ModId = Ndr_AddModule( pDesign, 1 );
    // add primary inputs
    Vec_Int_t * vFanins = Vec_IntAlloc( 10 );
    Wlc_NtkForEachPi( pNtk, pObj, i ) 
    {
        iOutId = Wlc_ObjId(pNtk, pObj);
        Ndr_AddObject( pDesign, ModId, ABC_OPER_CI, 0,   
            pObj->End, pObj->Beg, pObj->Signed,   
            0, NULL,      1, &iOutId,  NULL  ); // no fanins
    }
    // add internal nodes 
    Wlc_NtkForEachObj( pNtk, pObj, iOutId ) 
    {
        char * pFunction = NULL;
        if ( Wlc_ObjIsPi(pObj) || pObj->Type == 0 )
            continue;
        Vec_IntClear( vFanins );
        Wlc_ObjForEachFanin( pObj, iFanin, k )
            Vec_IntPush( vFanins, iFanin );
        if ( pObj->Type == WLC_OBJ_CONST )
            pFunction = Ndr_ObjWriteConstant( (unsigned *)Wlc_ObjFanins(pObj), Wlc_ObjRange(pObj) );
        if ( pObj->Type == WLC_OBJ_MUX && Wlc_ObjRange(Wlc_ObjFanin0(pNtk, pObj)) > 1 )
            Type = ABC_OPER_SEL_NMUX;
        else if ( pObj->Type == WLC_OBJ_FO )
        {
            Wlc_Obj_t * pFi = Wlc_ObjFo2Fi( pNtk, pObj );
            assert( Vec_IntSize(vFanins) == 0 );
            Vec_IntPush( vFanins, Wlc_ObjId(pNtk, pFi) );
            Vec_IntFillExtra( vFanins, 7, 0 );
            Type = ABC_OPER_DFFRSE;
        }
        else
            Type = Ndr_TypeWlc2Ndr(pObj->Type);
        assert( Type > 0 );
        Ndr_AddObject( pDesign, ModId, Type, 0,   
            pObj->End, pObj->Beg, pObj->Signed,   
            Vec_IntSize(vFanins), Vec_IntArray(vFanins), 1, &iOutId,  pFunction  ); 
    }
    // add primary outputs
    Wlc_NtkForEachObj( pNtk, pObj, iOutId ) 
    {
        if ( !Wlc_ObjIsPo(pObj) )
            continue;
        Vec_IntFill( vFanins, 1, iOutId );
        Ndr_AddObject( pDesign, ModId, ABC_OPER_CO, 0,                   
            pObj->End, pObj->Beg, pObj->Signed,   
            1, Vec_IntArray(vFanins),  0, NULL,  NULL ); 
    }
    Vec_IntFree( vFanins );
    return pDesign;
}